

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O2

int check_plan(void)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  
  lVar3 = (long)level;
  iVar4 = 0;
  if (tests_done[lVar3] != plan_test[lVar3]) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"# Looks like you planned %d tests but ran %d.\n",(ulong)(uint)plan_test[level],
            (ulong)(uint)tests_done[level]);
    lVar3 = (long)level;
    iVar4 = -1;
  }
  if (tests_failed[lVar3] != 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"# Looks like you failed %d test of %d run.\n",(ulong)(uint)tests_failed[level],
            (ulong)(uint)tests_done[level]);
    iVar4 = tests_failed[level];
  }
  iVar2 = level + -1;
  bVar1 = 0 < level;
  level = iVar2;
  if (bVar1) {
    __ok((uint)(iVar4 == 0),"subtests");
    if (iVar4 != 0) {
      __space((FILE *)_stderr);
      fwrite("#   Failed test \'",0x11,1,_stderr);
      fwrite("subtests",8,1,_stderr);
      fwrite("\'\n",2,1,_stderr);
      __space((FILE *)_stderr);
      fprintf(_stderr,"#   in %s at line %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/common/test.c"
              ,0x35);
    }
  }
  return iVar4;
}

Assistant:

int
check_plan(void)
{
	int r = 0;
	if (tests_done[level] != plan_test[level]) {
		__space(stderr);
		fprintf(stderr,
			"# Looks like you planned %d tests but ran %d.\n",
			plan_test[level], tests_done[level]);
		r = -1;
	}

	if (tests_failed[level]) {
		__space(stderr);
		fprintf(stderr,
			"# Looks like you failed %d test of %d run.\n",
			tests_failed[level], tests_done[level]);
		r = tests_failed[level];
	}
	--level;
	if (level >= 0) {
		is(r, 0, "subtests");
	}
	return r;
}